

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O1

Hop_Obj_t *
Abc_NodeCollapseFunc1
          (Abc_Obj_t *pFanin,Abc_Obj_t *pFanout,Vec_Ptr_t *vFanins,int *pPermFanin,int *pPermFanout)

{
  void ***pppvVar1;
  Hop_Man_t *p;
  Vec_Ptr_t *pVVar2;
  int i;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  Hop_Obj_t *pHVar5;
  Hop_Obj_t *pRoot;
  Vec_Ptr_t *pVVar6;
  uint uVar7;
  ulong uVar8;
  Vec_Ptr_t *pVVar9;
  bool bVar10;
  
  pVVar4 = (Vec_Ptr_t *)(long)(pFanout->vFanins).nSize;
  uVar8 = 0;
  if ((long)pVVar4 < 1) {
    bVar10 = false;
  }
  else {
    pVVar6 = pFanout->pNtk->vObjs;
    pppvVar1 = &pVVar6->pArray;
    pVVar9 = (Vec_Ptr_t *)0x0;
    do {
      bVar10 = (Abc_Obj_t *)(*pppvVar1)[(pFanout->vFanins).pArray[(long)pVVar9]] == pFanin;
      pVVar2 = pVVar6;
      if (bVar10) {
        pVVar2 = pVVar9;
      }
      pVVar6 = (Vec_Ptr_t *)((ulong)pVVar2 & 0xffffffff);
      uVar7 = (int)uVar8 + (uint)bVar10;
      uVar8 = (ulong)uVar7;
      pVVar9 = (Vec_Ptr_t *)((long)&pVVar9->nCap + 1);
    } while (pVVar4 != pVVar9);
    bVar10 = uVar7 == 1;
    uVar8 = (ulong)(int)pVVar2;
  }
  if (!bVar10) {
    return (Hop_Obj_t *)0x0;
  }
  p = (Hop_Man_t *)pFanin->pNtk->pManFunc;
  i = Abc_NodeCollapseSuppSize(pFanin,pFanout,vFanins);
  Hop_IthVar(p,i);
  if (p->nObjs[2] <= i) {
    __assert_fail("nSize + 1 <= Hop_ManPiNum(pMan)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                  ,0x226,
                  "Hop_Obj_t *Abc_NodeCollapseFunc1(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
                 );
  }
  iVar3 = Abc_NodeCollapsePermMap(pFanin,(Abc_Obj_t *)0x0,vFanins,pPermFanin);
  if (iVar3 != 0) {
    iVar3 = Abc_NodeCollapsePermMap(pFanout,pFanin,vFanins,pPermFanout);
    if (iVar3 != 0) {
      pPermFanout[uVar8] = i;
      pHVar5 = Hop_Permute(p,(Hop_Obj_t *)(pFanin->field_5).pData,(pFanin->vFanins).nSize,pPermFanin
                          );
      pRoot = Hop_Permute(p,(Hop_Obj_t *)(pFanout->field_5).pData,(pFanout->vFanins).nSize,
                          pPermFanout);
      pHVar5 = Hop_Compose(p,pRoot,pHVar5,i);
      return pHVar5;
    }
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                  ,0x22b,
                  "Hop_Obj_t *Abc_NodeCollapseFunc1(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
                 );
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                ,0x229,
                "Hop_Obj_t *Abc_NodeCollapseFunc1(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
               );
}

Assistant:

Hop_Obj_t * Abc_NodeCollapseFunc1( Abc_Obj_t * pFanin, Abc_Obj_t * pFanout, Vec_Ptr_t * vFanins, int * pPermFanin, int * pPermFanout )
{
    Hop_Man_t * pMan = (Hop_Man_t *)pFanin->pNtk->pManFunc;
    Hop_Obj_t * bFanin, * bFanout;
    int RetValue, nSize, iFanin;
    // can only eliminate if fanin occurs in the fanin list of the fanout exactly once
    if ( Abc_NodeCheckDupFanin( pFanin, pFanout, &iFanin ) != 1 )
        return NULL;
    // find the new number of fanins after collapsing
    nSize = Abc_NodeCollapseSuppSize( pFanin, pFanout, vFanins );
    Hop_IthVar( pMan, nSize ); // use additional var for fanin variable
    assert( nSize + 1 <= Hop_ManPiNum(pMan) );
    // find the permutation after collapsing
    RetValue = Abc_NodeCollapsePermMap( pFanin, NULL, vFanins, pPermFanin );
    assert( RetValue );
    RetValue = Abc_NodeCollapsePermMap( pFanout, pFanin, vFanins, pPermFanout );
    assert( RetValue );
    // include fanin's variable
    pPermFanout[iFanin] = nSize;
    // create new function of fanin and fanout
    bFanin  = Hop_Permute( pMan, (Hop_Obj_t *)pFanin->pData,  Abc_ObjFaninNum(pFanin),  pPermFanin );
    bFanout = Hop_Permute( pMan, (Hop_Obj_t *)pFanout->pData, Abc_ObjFaninNum(pFanout), pPermFanout );
    // compose fanin into fanout
    return Hop_Compose( pMan, bFanout, bFanin, nSize );
}